

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

InputMap * Omega_h::read_input(InputMap *__return_storage_ptr__,path *path)

{
  bool bVar1;
  char *file;
  __cxx11 local_b8 [55];
  allocator local_81;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [39];
  ScopedTimer local_19;
  path *ppStack_18;
  ScopedTimer omega_h_scoped_function_timer;
  path *path_local;
  InputMap *map;
  
  ppStack_18 = path;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
             ,&local_81);
  std::operator+(local_60,(char *)local_80);
  std::__cxx11::to_string(local_b8,0x39c);
  std::operator+(local_40,local_60);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_19,"read_input",file);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  read_input_without_includes(__return_storage_ptr__,ppStack_18);
  do {
    bVar1 = handle_one_include(__return_storage_ptr__);
  } while (bVar1);
  ScopedTimer::~ScopedTimer(&local_19);
  return __return_storage_ptr__;
}

Assistant:

InputMap read_input(Omega_h::filesystem::path const& path) {
  OMEGA_H_TIME_FUNCTION;
  InputMap map = read_input_without_includes(path);
  while (handle_one_include(map))
    ;
  return map;
}